

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __m128 afVar6;
  __m128 _outp_9;
  __m128 _p_9;
  __m256 _outp_8;
  __m256 _p_8;
  int i_4;
  __m256 _b_256_4;
  __m128 _b_128_4;
  float _b_4;
  int y_2;
  float *ptr1_2;
  int z_1;
  int size_4;
  float *outptr_4;
  float *ptr_4;
  int q_3;
  __m128 _outp_7;
  __m128 _p_7;
  __m256 _outp_6;
  __m256 _p_6;
  int i_3;
  __m256 _b_256_3;
  __m128 _b_128_3;
  float _b_3;
  int z;
  int size_3;
  float *outptr_3;
  float *ptr1_1;
  float *ptr_3;
  int q_2;
  __m128 _outp_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _p_4;
  int i_2;
  __m256 _b_256_2;
  __m128 _b_128_2;
  float _b_2;
  int y_1;
  int size_2;
  float *outptr_2;
  float *ptr1;
  float *ptr_2;
  int q_1;
  __m128 _outp_3;
  __m128 _p_3;
  __m256 _outp_2;
  __m256 _p_2;
  int i_1;
  int size_1;
  __m256 _b_256_1;
  __m128 _b_128_1;
  float _b_1;
  float *outptr_1;
  float *ptr_1;
  int q;
  __m128 _outp_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p;
  int i;
  int size;
  __m256 _b_256;
  __m128 _b_128;
  float _b;
  float *outptr;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_add op;
  Mat *m_8;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  undefined1 local_1400 [32];
  undefined8 uStack_13e8;
  float local_13d0 [2];
  float afStack_13c8 [34];
  undefined1 local_1340 [32];
  float local_1320 [2];
  float afStack_1318 [22];
  undefined1 local_12c0 [32];
  float local_12a0 [2];
  float afStack_1298 [22];
  undefined1 local_1240 [32];
  float local_1220 [2];
  float afStack_1218 [22];
  undefined1 local_11c0 [32];
  float local_1190 [2];
  float afStack_1188 [6];
  float local_1170 [2];
  float afStack_1168 [2];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  int local_1104;
  __m256 *local_1100;
  __m256 *pafStack_10f8;
  binary_op_add *pbStack_10f0;
  undefined8 uStack_10e8;
  float local_10d0 [2];
  float afStack_10c8 [5];
  float local_10b4;
  int local_10b0;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined4 local_1088;
  long local_1080;
  undefined4 local_1078;
  undefined4 local_1074;
  undefined4 local_1070;
  undefined4 local_106c;
  undefined4 local_1068;
  undefined8 local_1060;
  long local_1058;
  int local_1050;
  int local_104c;
  undefined8 local_1048;
  undefined8 local_1040;
  undefined8 local_1038;
  undefined4 local_1030;
  long local_1028;
  undefined4 local_1020;
  undefined4 local_101c;
  undefined4 local_1018;
  undefined4 local_1014;
  undefined4 local_1010;
  undefined8 local_1008;
  float *local_1000;
  undefined8 local_ff8;
  undefined8 local_ff0;
  undefined8 local_fe8;
  undefined4 local_fe0;
  long local_fd8;
  undefined4 local_fd0;
  undefined4 local_fcc;
  undefined4 local_fc8;
  undefined4 local_fc4;
  undefined4 local_fc0;
  undefined8 local_fb8;
  float *local_fb0;
  int local_fa4;
  undefined8 local_fa0;
  float afStack_f98 [2];
  float local_f90 [2];
  float afStack_f88 [2];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  int local_f24;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float local_ef0 [2];
  float afStack_ee8 [3];
  float local_edc;
  int local_ed8;
  int local_ed4;
  undefined8 local_ed0;
  undefined8 local_ec8;
  undefined8 local_ec0;
  undefined4 local_eb8;
  long local_eb0;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined4 local_ea0;
  undefined4 local_e9c;
  undefined4 local_e98;
  undefined8 local_e90;
  float *local_e88;
  long local_e80;
  undefined8 local_e78;
  undefined8 local_e70;
  undefined8 local_e68;
  undefined4 local_e60;
  long local_e58;
  undefined4 local_e50;
  undefined4 local_e4c;
  undefined4 local_e48;
  undefined4 local_e44;
  undefined4 local_e40;
  undefined8 local_e38;
  float *local_e30;
  int local_e24;
  undefined8 local_e20;
  float afStack_e18 [2];
  float local_e10 [2];
  float afStack_e08 [2];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  int local_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d70 [2];
  float afStack_d68 [3];
  float local_d5c;
  int local_d58;
  int local_d54;
  undefined8 local_d50;
  undefined8 local_d48;
  undefined8 local_d40;
  undefined4 local_d38;
  long local_d30;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined4 local_d20;
  undefined4 local_d1c;
  undefined4 local_d18;
  undefined8 local_d10;
  float *local_d08;
  long local_d00;
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined4 local_ce0;
  long local_cd8;
  undefined4 local_cd0;
  undefined4 local_ccc;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined4 local_cc0;
  undefined8 local_cb8;
  float *local_cb0;
  int local_ca4;
  undefined8 local_ca0;
  float afStack_c98 [2];
  float local_c90 [2];
  float afStack_c88 [2];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  int local_c28;
  int local_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00 [2];
  float afStack_bf8 [3];
  float local_bec;
  undefined8 local_be8;
  undefined8 local_be0;
  undefined8 local_bd8;
  undefined4 local_bd0;
  long local_bc8;
  undefined4 local_bc0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined8 local_ba8;
  float *local_ba0;
  undefined8 local_b98;
  undefined8 local_b90;
  undefined8 local_b88;
  undefined4 local_b80;
  long local_b78;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined4 local_b60;
  undefined8 local_b58;
  float *local_b50;
  int local_b44;
  undefined8 local_b40;
  float afStack_b38 [2];
  float local_b30 [2];
  float afStack_b28 [2];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  int local_ac8;
  int local_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_a90 [2];
  float afStack_a88 [5];
  float local_a74;
  float *local_a70;
  float *local_a68;
  int local_a5c;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  int local_a48;
  binary_op_add local_a41 [9];
  long *local_a38;
  long *local_a30;
  long *local_a28;
  long local_a20;
  long local_a10;
  long *local_a08;
  undefined1 local_9fd;
  int local_9fc;
  undefined8 *local_9f0;
  undefined1 local_9e5;
  int local_9e4;
  undefined8 *local_9d8;
  undefined1 local_9cd;
  int local_9cc;
  undefined8 *local_9c0;
  undefined1 local_9b5;
  int local_9b4;
  undefined8 *local_9a8;
  undefined1 local_99d;
  int local_99c;
  undefined8 *local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 *local_978;
  undefined8 *local_960;
  long *local_958;
  long *local_950;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined1 local_8cd;
  int local_8cc;
  undefined8 *local_8c0;
  undefined1 local_8ad;
  int local_8ac;
  undefined8 *local_8a0;
  undefined1 local_88d;
  int local_88c;
  undefined8 *local_880;
  undefined1 local_86d;
  int local_86c;
  undefined8 *local_860;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  float *local_830;
  undefined1 (*local_828) [32];
  float *local_820;
  undefined1 (*local_818) [32];
  float *local_810;
  undefined1 (*local_808) [32];
  float *local_800;
  undefined1 (*local_7f8) [32];
  float *local_7f0;
  undefined1 (*local_7e8) [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float *local_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float *local_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float *local_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float *local_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float *local_6b8;
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_674;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_614;
  long local_610;
  undefined4 local_604;
  long local_600;
  float *local_5f8;
  undefined4 local_5ec;
  int local_5e8;
  int local_5e4;
  undefined8 *local_5e0;
  long local_5d8;
  undefined4 local_5cc;
  long local_5c8;
  float *local_5c0;
  undefined4 local_5b4;
  int local_5b0;
  int local_5ac;
  undefined8 *local_5a8;
  long local_5a0;
  undefined4 local_594;
  long local_590;
  float *local_588;
  undefined4 local_57c;
  int local_578;
  int local_574;
  undefined8 *local_570;
  long local_568;
  undefined4 local_55c;
  long local_558;
  float *local_550;
  undefined4 local_544;
  int local_540;
  int local_53c;
  undefined8 *local_538;
  long local_530;
  undefined4 local_524;
  long local_520;
  float *local_518;
  undefined4 local_50c;
  int local_508;
  int local_504;
  undefined8 *local_500;
  long local_4f8;
  undefined4 local_4ec;
  long local_4e8;
  float *local_4e0;
  undefined4 local_4d4;
  int local_4d0;
  int local_4cc;
  undefined8 *local_4c8;
  long local_4c0;
  undefined4 local_4b4;
  long local_4b0;
  float *local_4a8;
  undefined4 local_49c;
  int local_498;
  int local_494;
  undefined8 *local_490;
  long local_488;
  undefined4 local_47c;
  long local_478;
  float *local_470;
  undefined4 local_464;
  int local_460;
  int local_45c;
  undefined8 *local_458;
  long local_450;
  undefined4 local_444;
  long local_440;
  long local_438;
  undefined4 local_42c;
  int local_428;
  int local_424;
  undefined8 *local_420;
  undefined4 local_414;
  long local_410;
  undefined4 local_404;
  long local_400;
  undefined4 local_3f4;
  long local_3f0;
  undefined4 local_3e4;
  long local_3e0;
  undefined4 local_3d4;
  long local_3d0;
  undefined4 local_3c4;
  long local_3c0;
  undefined4 local_3b4;
  long local_3b0;
  undefined4 local_3a4;
  long local_3a0;
  undefined4 local_394;
  long local_390;
  undefined8 *local_330;
  undefined8 *local_320;
  undefined8 *local_310;
  undefined8 *local_300;
  undefined8 *local_2f0;
  undefined8 *local_2e0;
  undefined8 *local_2d0;
  undefined8 *local_2c0;
  undefined8 *local_2b0;
  int local_1bc;
  undefined8 *local_1b8;
  int local_1ac;
  int local_19c;
  int local_18c;
  long *local_188;
  int local_17c;
  long *local_178;
  float *local_170;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float local_120 [2];
  float afStack_118 [2];
  float local_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  float local_f0 [2];
  float afStack_e8 [2];
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  float afStack_c8 [4];
  float *local_b8;
  undefined8 local_b0;
  float afStack_a8 [4];
  float *local_98;
  undefined8 local_90;
  float afStack_88 [4];
  float *local_78;
  undefined8 local_70;
  float afStack_68 [4];
  float *local_58;
  undefined8 local_50;
  float afStack_48 [4];
  float *local_38;
  
  local_a48 = *(int *)((long)in_RDI + 0x2c);
  local_a4c = (int)in_RDI[6];
  local_a50 = *(int *)((long)in_RDI + 0x34);
  local_a54 = (int)in_RDI[7];
  local_a58 = (int)in_RDI[3];
  local_a38 = in_RDX;
  local_a30 = in_RSI;
  local_a28 = in_RDI;
  if (((int)in_RDI[5] == 2) && ((int)in_RSI[5] == 1)) {
    for (local_a5c = 0; local_a5c < local_a4c; local_a5c = local_a5c + 1) {
      local_188 = local_a28;
      local_18c = local_a5c;
      local_a68 = (float *)(*local_a28 +
                           (long)*(int *)((long)local_a28 + 0x2c) * (long)local_a5c * local_a28[2]);
      local_178 = local_a38;
      local_17c = local_a5c;
      local_a70 = (float *)(*local_a38 +
                           (long)*(int *)((long)local_a38 + 0x2c) * (long)local_a5c * local_a38[2]);
      local_a10 = (long)local_a5c;
      local_a08 = local_a30;
      local_a74 = *(float *)(*local_a30 + local_a10 * 4);
      if (local_a58 == 4) {
        local_950 = local_a30;
        local_128 = (float *)(*local_a30 + (long)(local_a5c << 2) * 4);
        local_1190 = *(float (*) [2])local_128;
        afStack_1188._0_8_ = *(undefined8 *)(local_128 + 2);
      }
      else {
        local_1190[1] = local_a74;
        local_1190[0] = local_a74;
        afStack_1188[1] = local_a74;
        afStack_1188[0] = local_a74;
        local_630 = local_a74;
        fStack_62c = local_a74;
        fStack_628 = local_a74;
        fStack_624 = local_a74;
        local_614 = local_a74;
      }
      local_a90[0] = local_1190[0];
      local_a90[1] = local_1190[1];
      afStack_a88[0] = afStack_1188[0];
      afStack_a88[1] = afStack_1188[1];
      if (local_a58 == 8) {
        local_958 = local_a30;
        local_7e8 = (undefined1 (*) [32])(*local_a30 + (long)(local_a5c << 3) * 4);
        local_11c0 = *local_7e8;
      }
      else {
        local_e0[0] = local_1190[0];
        local_e0[1] = local_1190[1];
        afStack_d8[0] = afStack_1188[0];
        afStack_d8[1] = afStack_1188[1];
        local_11c0._8_4_ = afStack_1188[0];
        local_11c0._12_4_ = afStack_1188[1];
        local_11c0._0_4_ = local_1190[0];
        local_11c0._4_4_ = local_1190[1];
        local_11c0._24_4_ = afStack_1188[0];
        local_11c0._28_4_ = afStack_1188[1];
        local_11c0._16_4_ = local_1190[0];
        local_11c0._20_4_ = local_1190[1];
      }
      local_ac0 = local_11c0._0_8_;
      uStack_ab8 = local_11c0._8_8_;
      uStack_ab0 = local_11c0._16_8_;
      uStack_aa8 = local_11c0._24_8_;
      local_ac4 = local_a48 * local_a58;
      for (local_ac8 = 0; local_ac8 + 7 < local_ac4; local_ac8 = local_ac8 + 8) {
        local_7f0 = local_a68;
        uVar3 = *(undefined8 *)local_a68;
        uVar2 = *(undefined8 *)(local_a68 + 2);
        uVar4 = *(undefined8 *)(local_a68 + 4);
        uVar5 = *(undefined8 *)(local_a68 + 6);
        local_b00 = uVar3;
        uStack_af8 = uVar2;
        uStack_af0 = uVar4;
        uStack_ae8 = uVar5;
        BinaryOp_x86_avx_functor::binary_op_add::func_pack8
                  (local_1400._16_8_,local_1400._8_8_,local_1400._0_8_);
        local_6b8 = local_a70;
        *(undefined8 *)local_a70 = uVar3;
        *(undefined8 *)(local_a70 + 2) = uVar2;
        *(undefined8 *)(local_a70 + 4) = uVar4;
        *(undefined8 *)(local_a70 + 6) = uVar5;
        local_a68 = local_a68 + 8;
        local_a70 = local_a70 + 8;
        local_b20 = uVar3;
        uStack_b18 = uVar2;
        uStack_b10 = uVar4;
        uStack_b08 = uVar5;
        local_6e0 = uVar3;
        uStack_6d8 = uVar2;
        uStack_6d0 = uVar4;
        uStack_6c8 = uVar5;
      }
      for (; local_ac8 + 3 < local_ac4; local_ac8 = local_ac8 + 4) {
        local_130 = local_a68;
        local_b30 = *(float (*) [2])local_a68;
        uVar3 = *(undefined8 *)(local_a68 + 2);
        afStack_b28 = (float  [2])uVar3;
        afVar6 = BinaryOp_x86_avx_functor::binary_op_add::func_pack4
                           (local_a41,(__m128 *)local_b30,(__m128 *)local_a90);
        local_b40 = afVar6._0_8_;
        local_38 = local_a70;
        *(undefined8 *)local_a70 = local_b40;
        *(undefined8 *)(local_a70 + 2) = uVar3;
        local_a68 = local_a68 + 4;
        local_a70 = local_a70 + 4;
        afStack_b38 = (float  [2])uVar3;
        local_50 = local_b40;
        afStack_48._0_8_ = uVar3;
      }
      for (; local_ac8 < local_ac4; local_ac8 = local_ac8 + 1) {
        fVar1 = BinaryOp_x86_avx_functor::binary_op_add::func(local_a41,local_a68,&local_a74);
        *local_a70 = fVar1;
        local_a68 = local_a68 + 1;
        local_a70 = local_a70 + 1;
      }
    }
  }
  if ((((int)local_a28[5] == 3) || ((int)local_a28[5] == 4)) && ((int)local_a30[5] == 1)) {
    for (local_b44 = 0; local_b44 < local_a54; local_b44 = local_b44 + 1) {
      local_990 = &local_b98;
      local_504 = *(int *)((long)local_a28 + 0x2c);
      local_508 = (int)local_a28[6];
      local_50c = *(undefined4 *)((long)local_a28 + 0x34);
      local_b50 = (float *)(*local_a28 + local_a28[8] * (long)local_b44 * local_a28[2]);
      local_520 = local_a28[2];
      local_524 = (undefined4)local_a28[3];
      local_530 = local_a28[4];
      local_500 = &local_b98;
      local_3d0 = (long)local_504 * (long)local_508 * local_520;
      local_960 = &local_b98;
      local_920 = &local_b98;
      local_860 = &local_be8;
      local_5e4 = *(int *)((long)local_a38 + 0x2c);
      local_5e8 = (int)local_a38[6];
      local_5ec = *(undefined4 *)((long)local_a38 + 0x34);
      local_ba0 = (float *)(*local_a38 + local_a38[8] * (long)local_b44 * local_a38[2]);
      local_600 = local_a38[2];
      local_604 = (undefined4)local_a38[3];
      local_610 = local_a38[4];
      local_5e0 = &local_be8;
      local_390 = (long)local_5e4 * (long)local_5e8 * local_600;
      local_838 = &local_be8;
      local_918 = &local_be8;
      local_b60 = 0;
      local_b64 = 0;
      local_b68 = 0;
      local_b6c = 0;
      local_b80 = 0;
      local_b88 = 0;
      local_b90 = 0;
      local_b98 = 0;
      local_394 = 0x10;
      local_3d4 = 0x10;
      local_86c = local_b44;
      local_86d = 1;
      local_99c = local_b44;
      local_99d = 1;
      local_b58 = 0;
      local_b70 = 0;
      local_be8 = 0;
      local_bd8 = 0;
      local_bd0 = 0;
      local_bc0 = 0;
      local_bbc = 0;
      local_bb8 = 0;
      local_bb4 = 0;
      local_bb0 = 0;
      local_ba8 = 0;
      local_be0 = 0;
      local_a20 = (long)local_b44;
      local_bec = *(float *)(*local_a30 + local_a20 * 4);
      if (local_a58 == 4) {
        local_138 = (float *)(*local_a30 + (long)(local_b44 << 2) * 4);
        local_1220 = *(float (*) [2])local_138;
        afStack_1218._0_8_ = *(undefined8 *)(local_138 + 2);
      }
      else {
        local_1220[1] = local_bec;
        local_1220[0] = local_bec;
        afStack_1218[1] = local_bec;
        afStack_1218[0] = local_bec;
        local_650 = local_bec;
        fStack_64c = local_bec;
        fStack_648 = local_bec;
        fStack_644 = local_bec;
        local_634 = local_bec;
      }
      local_c00[0] = local_1220[0];
      local_c00[1] = local_1220[1];
      afStack_bf8[0] = afStack_1218[0];
      afStack_bf8[1] = afStack_1218[1];
      if (local_a58 == 8) {
        local_7f8 = (undefined1 (*) [32])(*local_a30 + (long)(local_b44 << 3) * 4);
        local_1240 = *local_7f8;
      }
      else {
        local_f0[0] = local_1220[0];
        local_f0[1] = local_1220[1];
        afStack_e8[0] = afStack_1218[0];
        afStack_e8[1] = afStack_1218[1];
        local_1240._8_4_ = afStack_1218[0];
        local_1240._12_4_ = afStack_1218[1];
        local_1240._0_4_ = local_1220[0];
        local_1240._4_4_ = local_1220[1];
        local_1240._24_4_ = afStack_1218[0];
        local_1240._28_4_ = afStack_1218[1];
        local_1240._16_4_ = local_1220[0];
        local_1240._20_4_ = local_1220[1];
      }
      local_c20 = local_1240._0_8_;
      uStack_c18 = local_1240._8_8_;
      uStack_c10 = local_1240._16_8_;
      uStack_c08 = local_1240._24_8_;
      local_c24 = local_a48 * local_a4c * local_a50 * local_a58;
      local_5f8 = local_ba0;
      local_518 = local_b50;
      local_2c0 = local_918;
      local_2b0 = local_920;
      local_bc8 = local_610;
      local_b78 = local_530;
      for (local_c28 = 0; local_c28 + 7 < local_c24; local_c28 = local_c28 + 8) {
        local_800 = local_b50;
        uVar3 = *(undefined8 *)local_b50;
        uVar2 = *(undefined8 *)(local_b50 + 2);
        uVar4 = *(undefined8 *)(local_b50 + 4);
        uVar5 = *(undefined8 *)(local_b50 + 6);
        local_c60 = uVar3;
        uStack_c58 = uVar2;
        uStack_c50 = uVar4;
        uStack_c48 = uVar5;
        BinaryOp_x86_avx_functor::binary_op_add::func_pack8
                  (local_1400._16_8_,local_1400._8_8_,local_1400._0_8_);
        local_6e8 = local_ba0;
        *(undefined8 *)local_ba0 = uVar3;
        *(undefined8 *)(local_ba0 + 2) = uVar2;
        *(undefined8 *)(local_ba0 + 4) = uVar4;
        *(undefined8 *)(local_ba0 + 6) = uVar5;
        local_b50 = local_b50 + 8;
        local_ba0 = local_ba0 + 8;
        local_c80 = uVar3;
        uStack_c78 = uVar2;
        uStack_c70 = uVar4;
        uStack_c68 = uVar5;
        local_720 = uVar3;
        uStack_718 = uVar2;
        uStack_710 = uVar4;
        uStack_708 = uVar5;
      }
      for (; local_c28 + 3 < local_c24; local_c28 = local_c28 + 4) {
        local_140 = local_b50;
        local_c90 = *(float (*) [2])local_b50;
        uVar3 = *(undefined8 *)(local_b50 + 2);
        afStack_c88 = (float  [2])uVar3;
        afVar6 = BinaryOp_x86_avx_functor::binary_op_add::func_pack4
                           (local_a41,(__m128 *)local_c90,(__m128 *)local_c00);
        local_ca0 = afVar6._0_8_;
        local_58 = local_ba0;
        *(undefined8 *)local_ba0 = local_ca0;
        *(undefined8 *)(local_ba0 + 2) = uVar3;
        local_b50 = local_b50 + 4;
        local_ba0 = local_ba0 + 4;
        afStack_c98 = (float  [2])uVar3;
        local_70 = local_ca0;
        afStack_68._0_8_ = uVar3;
      }
      for (; local_c28 < local_c24; local_c28 = local_c28 + 1) {
        fVar1 = BinaryOp_x86_avx_functor::binary_op_add::func(local_a41,local_b50,&local_bec);
        *local_ba0 = fVar1;
        local_b50 = local_b50 + 1;
        local_ba0 = local_ba0 + 1;
      }
    }
  }
  if (((int)local_a28[5] == 3) && ((int)local_a30[5] == 2)) {
    for (local_ca4 = 0; local_ca4 < local_a54; local_ca4 = local_ca4 + 1) {
      local_9a8 = &local_cf8;
      local_4cc = *(int *)((long)local_a28 + 0x2c);
      local_4d0 = (int)local_a28[6];
      local_4d4 = *(undefined4 *)((long)local_a28 + 0x34);
      local_cb0 = (float *)(*local_a28 + local_a28[8] * (long)local_ca4 * local_a28[2]);
      local_4e8 = local_a28[2];
      local_4ec = (undefined4)local_a28[3];
      local_4f8 = local_a28[4];
      local_4c8 = &local_cf8;
      local_3e0 = (long)local_4cc * (long)local_4d0 * local_4e8;
      local_978 = &local_cf8;
      local_910 = &local_cf8;
      local_d00 = *local_a30 +
                  (long)*(int *)((long)local_a30 + 0x2c) * (long)local_ca4 * local_a30[2];
      local_880 = &local_d50;
      local_5ac = *(int *)((long)local_a38 + 0x2c);
      local_5b0 = (int)local_a38[6];
      local_5b4 = *(undefined4 *)((long)local_a38 + 0x34);
      local_d08 = (float *)(*local_a38 + local_a38[8] * (long)local_ca4 * local_a38[2]);
      local_5c8 = local_a38[2];
      local_5cc = (undefined4)local_a38[3];
      local_5d8 = local_a38[4];
      local_5a8 = &local_d50;
      local_3a0 = (long)local_5ac * (long)local_5b0 * local_5c8;
      local_840 = &local_d50;
      local_908 = &local_d50;
      local_cc0 = 0;
      local_cc4 = 0;
      local_cc8 = 0;
      local_ccc = 0;
      local_ce0 = 0;
      local_ce8 = 0;
      local_cf0 = 0;
      local_cf8 = 0;
      local_19c = local_ca4;
      local_3a4 = 0x10;
      local_3e4 = 0x10;
      local_88c = local_ca4;
      local_88d = 1;
      local_9b4 = local_ca4;
      local_9b5 = 1;
      local_cb8 = 0;
      local_cd0 = 0;
      local_d50 = 0;
      local_d40 = 0;
      local_d38 = 0;
      local_d28 = 0;
      local_d24 = 0;
      local_d20 = 0;
      local_d1c = 0;
      local_d18 = 0;
      local_d10 = 0;
      local_d48 = 0;
      local_d54 = local_a48 * local_a58;
      local_5c0 = local_d08;
      local_4e0 = local_cb0;
      local_2e0 = local_908;
      local_2d0 = local_910;
      local_d30 = local_5d8;
      local_cd8 = local_4f8;
      for (local_d58 = 0; local_d58 < local_a4c; local_d58 = local_d58 + 1) {
        local_d5c = *(float *)(local_d00 + (long)local_d58 * 4);
        if (local_a58 == 4) {
          local_148 = (float *)(local_d00 + (long)(local_d58 << 2) * 4);
          local_12a0 = *(float (*) [2])local_148;
          afStack_1298._0_8_ = *(undefined8 *)(local_148 + 2);
        }
        else {
          local_12a0[1] = local_d5c;
          local_12a0[0] = local_d5c;
          afStack_1298[1] = local_d5c;
          afStack_1298[0] = local_d5c;
          local_670 = local_d5c;
          fStack_66c = local_d5c;
          fStack_668 = local_d5c;
          fStack_664 = local_d5c;
          local_654 = local_d5c;
        }
        local_d70[0] = local_12a0[0];
        local_d70[1] = local_12a0[1];
        afStack_d68[0] = afStack_1298[0];
        afStack_d68[1] = afStack_1298[1];
        if (local_a58 == 8) {
          local_808 = (undefined1 (*) [32])(local_d00 + (long)(local_d58 << 3) * 4);
          local_12c0 = *local_808;
        }
        else {
          local_100[0] = local_12a0[0];
          local_100[1] = local_12a0[1];
          afStack_f8[0] = afStack_1298[0];
          afStack_f8[1] = afStack_1298[1];
          local_12c0._8_4_ = afStack_1298[0];
          local_12c0._12_4_ = afStack_1298[1];
          local_12c0._0_4_ = local_12a0[0];
          local_12c0._4_4_ = local_12a0[1];
          local_12c0._24_4_ = afStack_1298[0];
          local_12c0._28_4_ = afStack_1298[1];
          local_12c0._16_4_ = local_12a0[0];
          local_12c0._20_4_ = local_12a0[1];
        }
        local_da0 = local_12c0._0_8_;
        uStack_d98 = local_12c0._8_8_;
        uStack_d90 = local_12c0._16_8_;
        uStack_d88 = local_12c0._24_8_;
        for (local_da4 = 0; local_da4 + 7 < local_d54; local_da4 = local_da4 + 8) {
          local_810 = local_cb0;
          uVar3 = *(undefined8 *)local_cb0;
          uVar2 = *(undefined8 *)(local_cb0 + 2);
          uVar4 = *(undefined8 *)(local_cb0 + 4);
          uVar5 = *(undefined8 *)(local_cb0 + 6);
          local_de0 = uVar3;
          uStack_dd8 = uVar2;
          uStack_dd0 = uVar4;
          uStack_dc8 = uVar5;
          BinaryOp_x86_avx_functor::binary_op_add::func_pack8
                    (local_1400._16_8_,local_1400._8_8_,local_1400._0_8_);
          local_728 = local_d08;
          *(undefined8 *)local_d08 = uVar3;
          *(undefined8 *)(local_d08 + 2) = uVar2;
          *(undefined8 *)(local_d08 + 4) = uVar4;
          *(undefined8 *)(local_d08 + 6) = uVar5;
          local_cb0 = local_cb0 + 8;
          local_d08 = local_d08 + 8;
          local_e00 = uVar3;
          uStack_df8 = uVar2;
          uStack_df0 = uVar4;
          uStack_de8 = uVar5;
          local_760 = uVar3;
          uStack_758 = uVar2;
          uStack_750 = uVar4;
          uStack_748 = uVar5;
        }
        for (; local_da4 + 3 < local_d54; local_da4 = local_da4 + 4) {
          local_150 = local_cb0;
          local_e10 = *(float (*) [2])local_cb0;
          uVar3 = *(undefined8 *)(local_cb0 + 2);
          afStack_e08 = (float  [2])uVar3;
          afVar6 = BinaryOp_x86_avx_functor::binary_op_add::func_pack4
                             (local_a41,(__m128 *)local_e10,(__m128 *)local_d70);
          local_e20 = afVar6._0_8_;
          local_78 = local_d08;
          *(undefined8 *)local_d08 = local_e20;
          *(undefined8 *)(local_d08 + 2) = uVar3;
          local_cb0 = local_cb0 + 4;
          local_d08 = local_d08 + 4;
          afStack_e18 = (float  [2])uVar3;
          local_90 = local_e20;
          afStack_88._0_8_ = uVar3;
        }
        for (; local_da4 < local_d54; local_da4 = local_da4 + 1) {
          fVar1 = BinaryOp_x86_avx_functor::binary_op_add::func(local_a41,local_cb0,&local_d5c);
          *local_d08 = fVar1;
          local_cb0 = local_cb0 + 1;
          local_d08 = local_d08 + 1;
        }
      }
    }
  }
  if (((int)local_a28[5] == 4) && ((int)local_a30[5] == 2)) {
    for (local_e24 = 0; local_e24 < local_a54; local_e24 = local_e24 + 1) {
      local_9c0 = &local_e78;
      local_494 = *(int *)((long)local_a28 + 0x2c);
      local_498 = (int)local_a28[6];
      local_49c = *(undefined4 *)((long)local_a28 + 0x34);
      local_e30 = (float *)(*local_a28 + local_a28[8] * (long)local_e24 * local_a28[2]);
      local_4b0 = local_a28[2];
      local_4b4 = (undefined4)local_a28[3];
      local_4c0 = local_a28[4];
      local_490 = &local_e78;
      local_3f0 = (long)local_494 * (long)local_498 * local_4b0;
      local_980 = &local_e78;
      local_900 = &local_e78;
      local_e80 = *local_a30 +
                  (long)*(int *)((long)local_a30 + 0x2c) * (long)local_e24 * local_a30[2];
      local_8a0 = &local_ed0;
      local_574 = *(int *)((long)local_a38 + 0x2c);
      local_578 = (int)local_a38[6];
      local_57c = *(undefined4 *)((long)local_a38 + 0x34);
      local_e88 = (float *)(*local_a38 + local_a38[8] * (long)local_e24 * local_a38[2]);
      local_590 = local_a38[2];
      local_594 = (undefined4)local_a38[3];
      local_5a0 = local_a38[4];
      local_570 = &local_ed0;
      local_3b0 = (long)local_574 * (long)local_578 * local_590;
      local_848 = &local_ed0;
      local_8f8 = &local_ed0;
      local_e40 = 0;
      local_e44 = 0;
      local_e48 = 0;
      local_e4c = 0;
      local_e60 = 0;
      local_e68 = 0;
      local_e70 = 0;
      local_e78 = 0;
      local_1ac = local_e24;
      local_3b4 = 0x10;
      local_3f4 = 0x10;
      local_8ac = local_e24;
      local_8ad = 1;
      local_9cc = local_e24;
      local_9cd = 1;
      local_e38 = 0;
      local_e50 = 0;
      local_ed0 = 0;
      local_ec0 = 0;
      local_eb8 = 0;
      local_ea8 = 0;
      local_ea4 = 0;
      local_ea0 = 0;
      local_e9c = 0;
      local_e98 = 0;
      local_e90 = 0;
      local_ec8 = 0;
      local_ed4 = local_a48 * local_a4c * local_a58;
      local_588 = local_e88;
      local_4a8 = local_e30;
      local_300 = local_8f8;
      local_2f0 = local_900;
      local_eb0 = local_5a0;
      local_e58 = local_4c0;
      for (local_ed8 = 0; local_ed8 < local_a50; local_ed8 = local_ed8 + 1) {
        local_edc = *(float *)(local_e80 + (long)local_ed8 * 4);
        if (local_a58 == 4) {
          local_158 = (float *)(local_e80 + (long)(local_ed8 << 2) * 4);
          local_1320 = *(float (*) [2])local_158;
          afStack_1318._0_8_ = *(undefined8 *)(local_158 + 2);
        }
        else {
          local_1320[1] = local_edc;
          local_1320[0] = local_edc;
          afStack_1318[1] = local_edc;
          afStack_1318[0] = local_edc;
          local_690 = local_edc;
          fStack_68c = local_edc;
          fStack_688 = local_edc;
          fStack_684 = local_edc;
          local_674 = local_edc;
        }
        local_ef0[0] = local_1320[0];
        local_ef0[1] = local_1320[1];
        afStack_ee8[0] = afStack_1318[0];
        afStack_ee8[1] = afStack_1318[1];
        if (local_a58 == 8) {
          local_818 = (undefined1 (*) [32])(local_e80 + (long)(local_ed8 << 3) * 4);
          local_1340 = *local_818;
        }
        else {
          local_110[0] = local_1320[0];
          local_110[1] = local_1320[1];
          afStack_108[0] = afStack_1318[0];
          afStack_108[1] = afStack_1318[1];
          local_1340._8_4_ = afStack_1318[0];
          local_1340._12_4_ = afStack_1318[1];
          local_1340._0_4_ = local_1320[0];
          local_1340._4_4_ = local_1320[1];
          local_1340._24_4_ = afStack_1318[0];
          local_1340._28_4_ = afStack_1318[1];
          local_1340._16_4_ = local_1320[0];
          local_1340._20_4_ = local_1320[1];
        }
        local_f20 = local_1340._0_8_;
        uStack_f18 = local_1340._8_8_;
        uStack_f10 = local_1340._16_8_;
        uStack_f08 = local_1340._24_8_;
        for (local_f24 = 0; local_f24 + 7 < local_ed4; local_f24 = local_f24 + 8) {
          local_820 = local_e30;
          uVar3 = *(undefined8 *)local_e30;
          uVar2 = *(undefined8 *)(local_e30 + 2);
          uVar4 = *(undefined8 *)(local_e30 + 4);
          uVar5 = *(undefined8 *)(local_e30 + 6);
          local_f60 = uVar3;
          uStack_f58 = uVar2;
          uStack_f50 = uVar4;
          uStack_f48 = uVar5;
          BinaryOp_x86_avx_functor::binary_op_add::func_pack8
                    (local_1400._16_8_,local_1400._8_8_,local_1400._0_8_);
          local_768 = local_e88;
          *(undefined8 *)local_e88 = uVar3;
          *(undefined8 *)(local_e88 + 2) = uVar2;
          *(undefined8 *)(local_e88 + 4) = uVar4;
          *(undefined8 *)(local_e88 + 6) = uVar5;
          local_e30 = local_e30 + 8;
          local_e88 = local_e88 + 8;
          local_f80 = uVar3;
          uStack_f78 = uVar2;
          uStack_f70 = uVar4;
          uStack_f68 = uVar5;
          local_7a0 = uVar3;
          uStack_798 = uVar2;
          uStack_790 = uVar4;
          uStack_788 = uVar5;
        }
        for (; local_f24 + 3 < local_ed4; local_f24 = local_f24 + 4) {
          local_160 = local_e30;
          local_f90 = *(float (*) [2])local_e30;
          uVar3 = *(undefined8 *)(local_e30 + 2);
          afStack_f88 = (float  [2])uVar3;
          afVar6 = BinaryOp_x86_avx_functor::binary_op_add::func_pack4
                             (local_a41,(__m128 *)local_f90,(__m128 *)local_ef0);
          local_fa0 = afVar6._0_8_;
          local_98 = local_e88;
          *(undefined8 *)local_e88 = local_fa0;
          *(undefined8 *)(local_e88 + 2) = uVar3;
          local_e30 = local_e30 + 4;
          local_e88 = local_e88 + 4;
          afStack_f98 = (float  [2])uVar3;
          local_b0 = local_fa0;
          afStack_a8._0_8_ = uVar3;
        }
        for (; local_f24 < local_ed4; local_f24 = local_f24 + 1) {
          fVar1 = BinaryOp_x86_avx_functor::binary_op_add::func(local_a41,local_e30,&local_edc);
          *local_e88 = fVar1;
          local_e30 = local_e30 + 1;
          local_e88 = local_e88 + 1;
        }
      }
    }
  }
  if (((int)local_a28[5] == 4) && ((int)local_a30[5] == 3)) {
    for (local_fa4 = 0; local_fa4 < local_a54; local_fa4 = local_fa4 + 1) {
      local_9d8 = &local_ff8;
      local_45c = *(int *)((long)local_a28 + 0x2c);
      local_460 = (int)local_a28[6];
      local_464 = *(undefined4 *)((long)local_a28 + 0x34);
      local_fb0 = (float *)(*local_a28 + local_a28[8] * (long)local_fa4 * local_a28[2]);
      local_478 = local_a28[2];
      local_47c = (undefined4)local_a28[3];
      local_488 = local_a28[4];
      local_458 = &local_ff8;
      local_400 = (long)local_45c * (long)local_460 * local_478;
      local_988 = &local_ff8;
      local_8f0 = &local_ff8;
      local_8c0 = &local_1048;
      local_53c = *(int *)((long)local_a38 + 0x2c);
      local_540 = (int)local_a38[6];
      local_544 = *(undefined4 *)((long)local_a38 + 0x34);
      local_1000 = (float *)(*local_a38 + local_a38[8] * (long)local_fa4 * local_a38[2]);
      local_558 = local_a38[2];
      local_55c = (undefined4)local_a38[3];
      local_568 = local_a38[4];
      local_538 = &local_1048;
      local_3c0 = (long)local_53c * (long)local_540 * local_558;
      local_850 = &local_1048;
      local_8e8 = &local_1048;
      local_fc0 = 0;
      local_fc4 = 0;
      local_fc8 = 0;
      local_fcc = 0;
      local_fe0 = 0;
      local_fe8 = 0;
      local_ff0 = 0;
      local_ff8 = 0;
      local_3c4 = 0x10;
      local_404 = 0x10;
      local_8cc = local_fa4;
      local_8cd = 1;
      local_9e4 = local_fa4;
      local_9e5 = 1;
      local_fb8 = 0;
      local_fd0 = 0;
      local_1048 = 0;
      local_1038 = 0;
      local_1030 = 0;
      local_1020 = 0;
      local_101c = 0;
      local_1018 = 0;
      local_1014 = 0;
      local_1010 = 0;
      local_1008 = 0;
      local_1040 = 0;
      local_104c = local_a48 * local_a58;
      local_550 = local_1000;
      local_470 = local_fb0;
      local_320 = local_8e8;
      local_310 = local_8f0;
      local_1028 = local_568;
      local_fd8 = local_488;
      for (local_1050 = 0; local_1050 < local_a50; local_1050 = local_1050 + 1) {
        local_9f0 = &local_10a0;
        local_424 = *(int *)((long)local_a30 + 0x2c);
        local_428 = (int)local_a30[6];
        local_42c = *(undefined4 *)((long)local_a30 + 0x34);
        local_438 = *local_a30 + local_a30[8] * (long)local_fa4 * local_a30[2];
        local_440 = local_a30[2];
        local_444 = (undefined4)local_a30[3];
        local_450 = local_a30[4];
        local_420 = &local_10a0;
        local_410 = (long)local_424 * (long)local_428 * local_440;
        local_1b8 = &local_10a0;
        local_1058 = local_438 + (long)local_424 * (long)local_1050 * local_440;
        local_8e0 = &local_10a0;
        local_1bc = local_1050;
        local_414 = 0x10;
        local_9fc = local_fa4;
        local_9fd = 1;
        local_10a0 = 0;
        local_1090 = 0;
        local_1088 = 0;
        local_1078 = 0;
        local_1074 = 0;
        local_1070 = 0;
        local_106c = 0;
        local_1068 = 0;
        local_1060 = 0;
        local_1098 = 0;
        local_330 = local_8e0;
        local_1080 = local_450;
        for (local_10b0 = 0; local_10b0 < local_a4c; local_10b0 = local_10b0 + 1) {
          local_10b4 = *(float *)(local_1058 + (long)local_10b0 * 4);
          if (local_a58 == 4) {
            local_168 = (float *)(local_1058 + (long)(local_10b0 << 2) * 4);
            local_13d0 = *(float (*) [2])local_168;
            afStack_13c8._0_8_ = *(undefined8 *)(local_168 + 2);
          }
          else {
            local_13d0[1] = local_10b4;
            local_13d0[0] = local_10b4;
            afStack_13c8[1] = local_10b4;
            afStack_13c8[0] = local_10b4;
            local_6b0 = local_10b4;
            fStack_6ac = local_10b4;
            fStack_6a8 = local_10b4;
            fStack_6a4 = local_10b4;
            local_694 = local_10b4;
          }
          local_10d0[0] = local_13d0[0];
          local_10d0[1] = local_13d0[1];
          afStack_10c8[0] = afStack_13c8[0];
          afStack_10c8[1] = afStack_13c8[1];
          if (local_a58 == 8) {
            local_828 = (undefined1 (*) [32])(local_1058 + (long)(local_10b0 << 3) * 4);
            local_1400 = *local_828;
          }
          else {
            local_120[0] = local_13d0[0];
            local_120[1] = local_13d0[1];
            afStack_118[0] = afStack_13c8[0];
            afStack_118[1] = afStack_13c8[1];
            local_1400._8_4_ = afStack_13c8[0];
            local_1400._12_4_ = afStack_13c8[1];
            local_1400._0_4_ = local_13d0[0];
            local_1400._4_4_ = local_13d0[1];
            local_1400._24_4_ = afStack_13c8[0];
            local_1400._28_4_ = afStack_13c8[1];
            local_1400._16_4_ = local_13d0[0];
            local_1400._20_4_ = local_13d0[1];
          }
          uStack_10e8 = uStack_13e8;
          local_1100 = local_1400._0_8_;
          pafStack_10f8 = local_1400._8_8_;
          pbStack_10f0 = local_1400._16_8_;
          for (local_1104 = 0; local_1104 + 7 < local_104c; local_1104 = local_1104 + 8) {
            local_830 = local_fb0;
            uVar3 = *(undefined8 *)local_fb0;
            uVar2 = *(undefined8 *)(local_fb0 + 2);
            uVar4 = *(undefined8 *)(local_fb0 + 4);
            uVar5 = *(undefined8 *)(local_fb0 + 6);
            local_1140 = uVar3;
            uStack_1138 = uVar2;
            uStack_1130 = uVar4;
            uStack_1128 = uVar5;
            BinaryOp_x86_avx_functor::binary_op_add::func_pack8
                      (local_1400._16_8_,local_1400._8_8_,local_1400._0_8_);
            local_7a8 = local_1000;
            *(undefined8 *)local_1000 = uVar3;
            *(undefined8 *)(local_1000 + 2) = uVar2;
            *(undefined8 *)(local_1000 + 4) = uVar4;
            *(undefined8 *)(local_1000 + 6) = uVar5;
            local_fb0 = local_fb0 + 8;
            local_1000 = local_1000 + 8;
            local_1160 = uVar3;
            uStack_1158 = uVar2;
            uStack_1150 = uVar4;
            uStack_1148 = uVar5;
            local_7e0 = uVar3;
            uStack_7d8 = uVar2;
            uStack_7d0 = uVar4;
            uStack_7c8 = uVar5;
          }
          for (; local_1104 + 3 < local_104c; local_1104 = local_1104 + 4) {
            local_170 = local_fb0;
            local_1170 = *(float (*) [2])local_fb0;
            uVar3 = *(undefined8 *)(local_fb0 + 2);
            afStack_1168 = (float  [2])uVar3;
            afVar6 = BinaryOp_x86_avx_functor::binary_op_add::func_pack4
                               (local_a41,(__m128 *)local_1170,(__m128 *)local_10d0);
            local_d0 = afVar6._0_8_;
            local_b8 = local_1000;
            *(undefined8 *)local_1000 = local_d0;
            *(undefined8 *)(local_1000 + 2) = uVar3;
            local_fb0 = local_fb0 + 4;
            local_1000 = local_1000 + 4;
            afStack_c8._0_8_ = uVar3;
          }
          for (; local_1104 < local_104c; local_1104 = local_1104 + 1) {
            fVar1 = BinaryOp_x86_avx_functor::binary_op_add::func(local_a41,local_fb0,&local_10b4);
            *local_1000 = fVar1;
            local_fb0 = local_fb0 + 1;
            local_1000 = local_1000 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2 && b.dims == 1)
    {
        // type 8
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            float* outptr = c.row(y);

            const float _b = b[y];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + y * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if ((a.dims == 3 || a.dims == 4) && b.dims == 1)
    {
        // type 9 11
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const float _b = b[q];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + q * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * h * d * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if (a.dims == 3 && b.dims == 2)
    {
        // type 10
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int y = 0; y < h; y++)
            {
                const float _b = ptr1[y];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 2)
    {
        // type 12
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * h * elempack;

            for (int z = 0; z < d; z++)
            {
                const float _b = ptr1[z];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + z * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + z * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + z * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 3)
    {
        // type 13
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int z = 0; z < d; z++)
            {
                const float* ptr1 = b.channel(q).row(z);

                for (int y = 0; y < h; y++)
                {
                    const float _b = ptr1[y];
#if __SSE2__
                    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        __m512 _outp = op.func_pack16(_p, _b_512);
                        _mm512_storeu_ps(outptr, _outp);
                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _outp = op.func_pack8(_p, _b_256);
                        _mm256_storeu_ps(outptr, _outp);
                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        __m128 _outp = op.func_pack4(_p, _b_128);
                        _mm_storeu_ps(outptr, _outp);
                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr = op.func(*ptr, _b);
                        ptr += 1;
                        outptr += 1;
                    }
                }
            }
        }
    }

    return 0;
}